

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMarkers.cpp
# Opt level: O2

void __thiscall
chrono::ChLinkMarkers::Initialize
          (ChLinkMarkers *this,shared_ptr<chrono::ChBody> *mbody1,shared_ptr<chrono::ChBody> *mbody2
          ,bool pos_are_relative,ChCoordsys<double> *mpos1,ChCoordsys<double> *mpos2)

{
  element_type *peVar1;
  element_type *peVar2;
  ChBody *pCVar3;
  uint __line;
  ChMarker *pCVar4;
  char *__assertion;
  shared_ptr<chrono::ChMarker> mmark2;
  shared_ptr<chrono::ChMarker> mmark1;
  __shared_ptr<chrono::ChMarker,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<chrono::ChMarker,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  peVar1 = (mbody1->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  peVar2 = (mbody2->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (peVar1 == peVar2) {
    __assertion = "mbody1.get() != mbody2.get()";
    __line = 0x70;
  }
  else {
    if ((peVar1->super_ChPhysicsItem).system == (peVar2->super_ChPhysicsItem).system) {
      pCVar4 = (ChMarker *)Eigen::internal::aligned_malloc(0x340);
      ChMarker::ChMarker(pCVar4);
      std::__shared_ptr<chrono::ChMarker,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<chrono::ChMarker,void>
                ((__shared_ptr<chrono::ChMarker,(__gnu_cxx::_Lock_policy)2> *)&mmark1,pCVar4);
      pCVar4 = (ChMarker *)Eigen::internal::aligned_malloc(0x340);
      ChMarker::ChMarker(pCVar4);
      std::__shared_ptr<chrono::ChMarker,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<chrono::ChMarker,void>
                ((__shared_ptr<chrono::ChMarker,(__gnu_cxx::_Lock_policy)2> *)&mmark2,pCVar4);
      pCVar3 = (mbody1->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      std::__shared_ptr<chrono::ChMarker,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_40,&mmark1.super___shared_ptr<chrono::ChMarker,_(__gnu_cxx::_Lock_policy)2>)
      ;
      ChBody::AddMarker(pCVar3,(shared_ptr<chrono::ChMarker> *)&local_40);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
      pCVar3 = (mbody2->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      std::__shared_ptr<chrono::ChMarker,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_50,&mmark2.super___shared_ptr<chrono::ChMarker,_(__gnu_cxx::_Lock_policy)2>)
      ;
      ChBody::AddMarker(pCVar3,(shared_ptr<chrono::ChMarker> *)&local_50);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
      ReferenceMarkers(this,mmark1.super___shared_ptr<chrono::ChMarker,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr,
                       mmark2.super___shared_ptr<chrono::ChMarker,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
      if (pos_are_relative) {
        ChMarker::Impose_Rel_Coord
                  (mmark1.super___shared_ptr<chrono::ChMarker,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                   mpos1);
        ChMarker::Impose_Rel_Coord
                  (mmark2.super___shared_ptr<chrono::ChMarker,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                   mpos2);
      }
      else {
        ChMarker::Impose_Abs_Coord
                  (mmark1.super___shared_ptr<chrono::ChMarker,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                   mpos1);
        ChMarker::Impose_Abs_Coord
                  (mmark2.super___shared_ptr<chrono::ChMarker,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                   mpos2);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&mmark2.super___shared_ptr<chrono::ChMarker,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&mmark1.super___shared_ptr<chrono::ChMarker,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      return;
    }
    __assertion = "mbody1->GetSystem() == mbody2->GetSystem()";
    __line = 0x71;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChLinkMarkers.cpp"
                ,__line,
                "virtual void chrono::ChLinkMarkers::Initialize(std::shared_ptr<ChBody>, std::shared_ptr<ChBody>, bool, const ChCoordsys<> &, const ChCoordsys<> &)"
               );
}

Assistant:

void ChLinkMarkers::Initialize(std::shared_ptr<ChBody> mbody1,
                               std::shared_ptr<ChBody> mbody2,
                               bool pos_are_relative,
                               const ChCoordsys<>& mpos1,
                               const ChCoordsys<>& mpos2) {
    assert(mbody1.get() != mbody2.get());
    assert(mbody1->GetSystem() == mbody2->GetSystem());

    // create markers to add to the two bodies
    std::shared_ptr<ChMarker> mmark1(new ChMarker);
    std::shared_ptr<ChMarker> mmark2(new ChMarker);
    mbody1->AddMarker(mmark1);
    mbody2->AddMarker(mmark2);

    ChMarker* mm1 = mmark1.get();
    ChMarker* mm2 = mmark2.get();
    ReferenceMarkers(mm1, mm2);

    if (pos_are_relative) {
        mmark1->Impose_Rel_Coord(mpos1);
        mmark2->Impose_Rel_Coord(mpos2);
    } else {
        mmark1->Impose_Abs_Coord(mpos1);
        mmark2->Impose_Abs_Coord(mpos2);
    }
}